

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O1

void arith_uint256_tests::shiftArrayRight(uchar *to,uchar *from,uint arrayLength,uint bitsToShift)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (ulong)(arrayLength >> 3);
  bVar2 = (byte)arrayLength & 7;
  lVar4 = 0;
  do {
    if (uVar3 + lVar4 < 0x20) {
      bVar5 = from[lVar4 + uVar3] >> bVar2;
    }
    else {
      bVar5 = 0;
    }
    to[lVar4] = bVar5;
    if (uVar3 + lVar4 < 0x1f) {
      to[lVar4] = to[lVar4] | from[lVar4 + uVar3 + 1] << (8 - bVar2 & 0x1f);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x20);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void shiftArrayRight(unsigned char* to, const unsigned char* from, unsigned int arrayLength, unsigned int bitsToShift)
{
    for (unsigned int T=0; T < arrayLength; ++T)
    {
        unsigned int F = (T+bitsToShift/8);
        if (F < arrayLength)
            to[T] = uint8_t(from[F] >> (bitsToShift % 8));
        else
            to[T] = 0;
        if (F + 1 < arrayLength)
            to[T] |= uint8_t(from[(F + 1)] << (8 - bitsToShift % 8));
    }
}